

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

void __thiscall ot::commissioner::DtlsSession::Reconnect(DtlsSession *this)

{
  function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)> local_30;
  
  if (this->mIsServer != false) {
    Reset(this);
    std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::function
              (&local_30,&this->mOnConnected);
    Connect(this,&local_30);
    std::_Function_base::~_Function_base(&local_30.super__Function_base);
    return;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls.cpp"
                ,0x130,"void ot::commissioner::DtlsSession::Reconnect()");
}

Assistant:

void DtlsSession::Reconnect()
{
    ASSERT(mIsServer);
    Reset();
    Connect(mOnConnected);
}